

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O2

void __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::ClassSet
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,int pmax)

{
  undefined8 *puVar1;
  Item *pIVar2;
  long lVar3;
  int i;
  long lVar4;
  
  if (pmax < 1) {
    pmax = 8;
  }
  this->theitem = (Item *)0x0;
  this->thekey = (DataKey *)0x0;
  this->themax = pmax;
  this->thesize = 0;
  this->thenum = 0;
  this->firstfree = ~pmax;
  spx_alloc<soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::Item*>(&this->theitem,pmax);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < this->themax; lVar4 = lVar4 + 1) {
    pIVar2 = this->theitem;
    puVar1 = (undefined8 *)((long)&(pIVar2->data).thenext + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(pIVar2->data).super_SVectorBase<double>.m_elem + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pIVar2->info + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  }
  spx_alloc<soplex::DataKey*>(&this->thekey,this->themax);
  return;
}

Assistant:

explicit
   ClassSet(int pmax = 8)
      : theitem(nullptr)
      , thekey(nullptr)
      , themax(pmax < 1 ? 8 : pmax)
      , thesize(0)
      , thenum(0)

   {
      firstfree = -themax - 1;

      spx_alloc(theitem, themax);

      /* call default constructor for each element */
      for(int i = 0; i < themax; i++)
         new(&(theitem[i])) Item();

      try
      {
         spx_alloc(thekey, themax);
      }
      catch(const SPxMemoryException& x)
      {
         spx_free(theitem);
         throw x;
      }

      assert(isConsistent());
   }